

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O1

void eve::readevents(vector<int,_std::allocator<int>_> *events)

{
  uint uVar1;
  iterator __position;
  result_type rVar2;
  FILE *__stream;
  size_t sVar3;
  char in_CL;
  undefined8 *extraout_RDX;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *__ptr;
  int eventid;
  uniform_int_distribution<int> uStack_68;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> lStack_60;
  vector<int,_std::allocator<int>_> *pvStack_58;
  int local_1c;
  
  iVar5 = 0x104004;
  iVar4 = 0x104015;
  __stream = fopen("input/events.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar3 = fread(&local_1c,4,1,__stream);
    if (sVar3 == 1) {
      do {
        __position._M_current =
             (events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (__position._M_current ==
            (events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)events,__position,&local_1c);
        }
        else {
          *__position._M_current = local_1c;
          (events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        sVar3 = fread(&local_1c,4,1,__stream);
      } while (sVar3 == 1);
    }
    fclose(__stream);
    return;
  }
  readevents();
  lStack_60._M_x = 0x4d2;
  __ptr = (uint *)*extraout_RDX;
  if (__ptr != (uint *)extraout_RDX[1]) {
    iVar6 = (int)((ulong)(extraout_RDX[1] - (long)__ptr) >> 2);
    iVar5 = -iVar5;
    pvStack_58 = events;
    do {
      iVar5 = iVar5 + 1;
      iVar6 = iVar6 + -1;
      uStack_68._M_param._M_a = 0;
      uStack_68._M_param._M_b = iVar6;
      rVar2 = std::uniform_int_distribution<int>::operator()
                        (&uStack_68,&lStack_60,&uStack_68._M_param);
      uVar1 = *__ptr;
      *__ptr = __ptr[rVar2];
      __ptr[rVar2] = uVar1;
      if (iVar5 % iVar4 == 0) {
        if (in_CL == '\0') {
          fwrite(__ptr,4,1,_stdout);
        }
        else {
          fprintf(_stdout,"%d\n",(ulong)*__ptr);
        }
      }
      __ptr = __ptr + 1;
    } while (__ptr != (uint *)extraout_RDX[1]);
  }
  return;
}

Assistant:

void readevents(std::vector<int> &events) {
        FILE *fin = fopen(EVENTS_FILE, "rb");
        if (fin == NULL) {
            fprintf(stderr, "FATAL: %s: %s: cannot open %s\n", progname, __func__,
                    EVENTS_FILE);
            exit(EXIT_FAILURE);
        }
        int eventid;
        while (fread(&eventid, sizeof(eventid), 1, fin) == 1) {
            events.push_back(eventid);
        }
        fclose(fin);
    }